

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O3

void __thiscall Lodtalk::SpecialRuntimeObjects::initialize(SpecialRuntimeObjects *this)

{
  VMContext *this_00;
  
  this_00 = this->context;
  VMContext::disableGC(this_00);
  createSpecialObjectTable(this);
  createSpecialClassTable(this);
  registerGCRoots(this);
  VMContext::enableGC(this_00);
  return;
}

Assistant:

void SpecialRuntimeObjects::initialize()
{
    WithoutGC wgc(context);

    createSpecialObjectTable();
    createSpecialClassTable();
    registerGCRoots();
}